

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::SuggestFieldNumbers
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  ErrorLocation location;
  Message *descriptor;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer prVar4;
  int *piVar5;
  FieldDescriptor *pFVar6;
  iterator iVar7;
  iterator iVar8;
  string_view sVar9;
  VoidPtr local_128;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_120;
  string_view local_118;
  undefined1 local_108 [8];
  anon_class_32_4_93375ba9 make_error;
  int current_ordinal;
  value_type local_d0;
  value_type local_c8;
  ExtensionRange *local_c0;
  ExtensionRange *range_1;
  ReservedRange *pRStack_b0;
  int i_3;
  ReservedRange *range;
  int local_a0;
  int i_2;
  int i_1;
  int local_8c;
  anon_class_8_1_e1c71c84 aStack_88;
  int i;
  anon_class_8_1_e1c71c84 add_range;
  anon_class_8_1_e1c71c84 add_ordinal;
  vector<Range,_std::allocator<Range>_> used_ordinals;
  int fields_to_suggest;
  int kMaxSuggestions;
  MessageHints *hints;
  undefined1 local_40 [8];
  iterator hints_it;
  Descriptor *message;
  int message_index;
  FileDescriptorProto *proto_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  message._4_4_ = 0;
  while( true ) {
    iVar2 = FileDescriptor::message_type_count(file);
    if (iVar2 <= message._4_4_) break;
    hints_it.field_1.slot_ = (slot_type *)(file->message_types_ + message._4_4_);
    _local_40 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                ::find<google::protobuf::Descriptor_const*>
                          ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                            *)&this->message_hints_,
                           (key_arg<const_google::protobuf::Descriptor_*> *)&hints_it.field_1.slot_)
    ;
    _hints = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
             ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                    *)&this->message_hints_);
    bVar1 = absl::lts_20250127::container_internal::operator==
                      ((iterator *)local_40,(iterator *)&hints);
    if (!bVar1) {
      prVar4 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
               ::iterator::operator->((iterator *)local_40);
      used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
      piVar5 = std::min<int>((int *)((long)&used_ordinals.
                                            super__Vector_base<Range,_std::allocator<Range>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                             &(prVar4->second).fields_to_suggest);
      used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = *piVar5;
      if (0 < (int)used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
        std::vector<Range,_std::allocator<Range>_>::vector
                  ((vector<Range,_std::allocator<Range>_> *)&add_ordinal);
        add_range.used_ordinals = (vector<Range,_std::allocator<Range>_> *)&add_ordinal;
        aStack_88.used_ordinals = (vector<Range,_std::allocator<Range>_> *)&add_ordinal;
        local_8c = 0;
        while( true ) {
          iVar2 = local_8c;
          iVar3 = Descriptor::field_count((Descriptor *)hints_it.field_1.slot_);
          if (iVar3 <= iVar2) break;
          pFVar6 = Descriptor::field((Descriptor *)hints_it.field_1.slot_,local_8c);
          iVar2 = FieldDescriptor::number(pFVar6);
          SuggestFieldNumbers::anon_class_8_1_e1c71c84::operator()(&add_range,iVar2);
          local_8c = local_8c + 1;
        }
        local_a0 = 0;
        while( true ) {
          iVar2 = local_a0;
          iVar3 = Descriptor::extension_count((Descriptor *)hints_it.field_1.slot_);
          if (iVar3 <= iVar2) break;
          pFVar6 = Descriptor::extension((Descriptor *)hints_it.field_1.slot_,local_a0);
          iVar2 = FieldDescriptor::number(pFVar6);
          SuggestFieldNumbers::anon_class_8_1_e1c71c84::operator()(&add_range,iVar2);
          local_a0 = local_a0 + 1;
        }
        range._4_4_ = 0;
        while( true ) {
          iVar2 = range._4_4_;
          iVar3 = Descriptor::reserved_range_count((Descriptor *)hints_it.field_1.slot_);
          if (iVar3 <= iVar2) break;
          pRStack_b0 = Descriptor::reserved_range((Descriptor *)hints_it.field_1.slot_,range._4_4_);
          SuggestFieldNumbers::anon_class_8_1_e1c71c84::operator()
                    (&stack0xffffffffffffff78,pRStack_b0->start,pRStack_b0->end);
          range._4_4_ = range._4_4_ + 1;
        }
        range_1._4_4_ = 0;
        while( true ) {
          iVar2 = range_1._4_4_;
          iVar3 = Descriptor::extension_range_count((Descriptor *)hints_it.field_1.slot_);
          if (iVar3 <= iVar2) break;
          local_c0 = Descriptor::extension_range((Descriptor *)hints_it.field_1.slot_,range_1._4_4_)
          ;
          iVar2 = Descriptor::ExtensionRange::start_number(local_c0);
          iVar3 = Descriptor::ExtensionRange::end_number(local_c0);
          SuggestFieldNumbers::anon_class_8_1_e1c71c84::operator()
                    (&stack0xffffffffffffff78,iVar2,iVar3);
          range_1._4_4_ = range_1._4_4_ + 1;
        }
        local_c8.from = 0x1fffffff;
        local_c8.to = 0x20000000;
        std::vector<Range,_std::allocator<Range>_>::push_back
                  ((vector<Range,_std::allocator<Range>_> *)&add_ordinal,&local_c8);
        local_d0.from = 19000;
        local_d0.to = 19999;
        std::vector<Range,_std::allocator<Range>_>::push_back
                  ((vector<Range,_std::allocator<Range>_> *)&add_ordinal,&local_d0);
        iVar7 = std::vector<Range,_std::allocator<Range>_>::begin
                          ((vector<Range,_std::allocator<Range>_> *)&add_ordinal);
        iVar8 = std::vector<Range,_std::allocator<Range>_>::end
                          ((vector<Range,_std::allocator<Range>_> *)&add_ordinal);
        std::
        sort<__gnu_cxx::__normal_iterator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range*,std::vector<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range,std::allocator<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::Range>>>,google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__3>
                  (iVar7._M_current,iVar8._M_current);
        make_error.fields_to_suggest._0_4_ = 1;
        if ((prVar4->second).first_reason != (Message *)0x0) {
          local_108 = (undefined1  [8])&hints_it.field_1;
          make_error.message = (Descriptor **)&add_ordinal;
          make_error.used_ordinals =
               (vector<Range,_std::allocator<Range>_> *)&make_error.fields_to_suggest;
          make_error.current_ordinal =
               (int *)&used_ordinals.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          sVar9 = Descriptor::full_name((Descriptor *)hints_it.field_1.slot_);
          descriptor = (prVar4->second).first_reason;
          location = (prVar4->second).first_reason_location;
          local_118 = sVar9;
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__0,void>
                    ((FunctionRef<std::__cxx11::string()> *)&local_128,
                     (anon_class_32_4_93375ba9 *)local_108);
          make_error_00.invoker_ = p_Stack_120;
          make_error_00.ptr_.obj = local_128.obj;
          AddError(this,local_118,descriptor,location,make_error_00);
        }
        std::vector<Range,_std::allocator<Range>_>::~vector
                  ((vector<Range,_std::allocator<Range>_> *)&add_ordinal);
      }
    }
    message._4_4_ = message._4_4_ + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::SuggestFieldNumbers(FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  for (int message_index = 0; message_index < file->message_type_count();
       message_index++) {
    const Descriptor* message = &file->message_types_[message_index];
    auto hints_it = message_hints_.find(message);
    if (hints_it == message_hints_.end()) continue;
    auto* hints = &hints_it->second;
    constexpr int kMaxSuggestions = 3;
    int fields_to_suggest = std::min(kMaxSuggestions, hints->fields_to_suggest);
    if (fields_to_suggest <= 0) continue;
    struct Range {
      int from;
      int to;
    };
    std::vector<Range> used_ordinals;
    auto add_ordinal = [&](int ordinal) {
      if (ordinal <= 0 || ordinal > FieldDescriptor::kMaxNumber) return;
      if (!used_ordinals.empty() && ordinal == used_ordinals.back().to) {
        used_ordinals.back().to = ordinal + 1;
      } else {
        used_ordinals.push_back({ordinal, ordinal + 1});
      }
    };
    auto add_range = [&](int from, int to) {
      from = std::max(0, std::min(FieldDescriptor::kMaxNumber + 1, from));
      to = std::max(0, std::min(FieldDescriptor::kMaxNumber + 1, to));
      if (from >= to) return;
      used_ordinals.push_back({from, to});
    };
    for (int i = 0; i < message->field_count(); i++) {
      add_ordinal(message->field(i)->number());
    }
    for (int i = 0; i < message->extension_count(); i++) {
      add_ordinal(message->extension(i)->number());
    }
    for (int i = 0; i < message->reserved_range_count(); i++) {
      auto range = message->reserved_range(i);
      add_range(range->start, range->end);
    }
    for (int i = 0; i < message->extension_range_count(); i++) {
      auto range = message->extension_range(i);
      add_range(range->start_number(), range->end_number());
    }
    used_ordinals.push_back(
        {FieldDescriptor::kMaxNumber, FieldDescriptor::kMaxNumber + 1});
    used_ordinals.push_back({FieldDescriptor::kFirstReservedNumber,
                             FieldDescriptor::kLastReservedNumber});
    std::sort(used_ordinals.begin(), used_ordinals.end(),
              [](Range lhs, Range rhs) {
                return std::tie(lhs.from, lhs.to) < std::tie(rhs.from, rhs.to);
              });
    int current_ordinal = 1;
    if (hints->first_reason) {
      auto make_error = [&] {
        std::stringstream id_list;
        id_list << "Suggested field numbers for " << message->full_name()
                << ": ";
        const char* separator = "";
        for (auto& current_range : used_ordinals) {
          while (current_ordinal < current_range.from &&
                 fields_to_suggest > 0) {
            id_list << separator << current_ordinal++;
            separator = ", ";
            fields_to_suggest--;
          }
          if (fields_to_suggest == 0) break;
          current_ordinal = std::max(current_ordinal, current_range.to);
        }
        return id_list.str();
      };
      AddError(message->full_name(), *hints->first_reason,
               hints->first_reason_location, make_error);
    }
  }
}